

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall Diligent::DeviceContextVkImpl::CommitVkVertexBuffers(DeviceContextVkImpl *this)

{
  Uint32 *Args_5;
  PipelineStateVkImpl *this_00;
  BufferVkImpl *pBuffer;
  Uint64 UVar1;
  pointer pMVar2;
  byte bVar3;
  Uint32 UVar4;
  VkBuffer pVVar5;
  size_t sVar6;
  VkDeviceSize VVar7;
  char (*in_RCX) [32];
  ulong uVar8;
  char *in_R8;
  bool bVar9;
  Uint64 *pUVar10;
  uint uVar11;
  char (*pacVar12) [32];
  string msg;
  VkBuffer vkVertexBuffers [32];
  VkDeviceSize Offsets [32];
  
  Args_5 = &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumVertexStreams;
  uVar11 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumVertexStreams;
  UVar4 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetNumBufferSlotsUsed
                    (&((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.
                      m_pObject)->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  if (uVar11 < UVar4) {
    this_00 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.m_pObject;
    PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
              (&this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    vkVertexBuffers[0]._0_4_ =
         PipelineStateBase<Diligent::EngineVkImplTraits>::GetNumBufferSlotsUsed
                   (&((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.
                     m_pObject)->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    in_R8 = "Currently bound pipeline state \'";
    in_RCX = (char (*) [32])0x277;
    LogError<false,char[33],char_const*,char[11],unsigned_int,char[31],unsigned_int,char[10]>
              (false,"CommitVkVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x277,(char (*) [33])"Currently bound pipeline state \'",
               (char **)&(this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                         .m_Desc,(char (*) [11])"\' expects ",(uint *)vkVertexBuffers,
               (char (*) [31])" input buffer slots, but only ",Args_5,(char (*) [10])0x6bf19e);
  }
  if (0x20 < *Args_5) {
    FormatString<char[31]>(&msg,(char (*) [31])"Too many buffers are being set");
    in_RCX = (char (*) [32])0x27c;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CommitVkVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x27c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (*Args_5 == 0) {
    bVar9 = true;
    uVar11 = 0;
  }
  else {
    pUVar10 = &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_VertexStreams[0].Offset;
    uVar8 = 0;
    bVar3 = 0;
    do {
      pBuffer = (((VertexStreamInfo<Diligent::BufferVkImpl> *)(pUVar10 + -1))->pBuffer).m_pObject;
      if (pBuffer == (BufferVkImpl *)0x0) {
        pVVar5 = BufferVkImpl::GetVkBuffer((this->m_DummyVB).m_pObject);
        vkVertexBuffers[uVar8] = pVVar5;
        VVar7 = 0;
      }
      else {
        if ((pBuffer->super_BufferBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
            .m_Desc.Usage == USAGE_DYNAMIC) {
          DvpVerifyDynamicAllocation(this,pBuffer);
          bVar3 = 1;
        }
        pVVar5 = BufferVkImpl::GetVkBuffer(pBuffer);
        vkVertexBuffers[uVar8] = pVVar5;
        UVar1 = *pUVar10;
        if ((pBuffer->m_VulkanBuffer).m_VkObject == (VkBuffer_T *)0x0) {
          DvpVerifyDynamicAllocation(this,pBuffer);
          pacVar12 = (char (*) [32])
                     (ulong)(pBuffer->super_BufferBase<Diligent::EngineVkImplTraits>).
                            m_DynamicBufferId;
          if (pacVar12 == (char (*) [32])0xffffffff) {
            FormatString<char[17],char_const*,char[34]>
                      (&msg,(Diligent *)"Dynamic buffer \'",
                       (char (*) [17])
                       &(pBuffer->super_BufferBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                        .m_Desc,(char **)"\' does not have dynamic buffer ID",(char (*) [34])in_R8);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"GetDynamicBufferOffset",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
                       ,0x2a2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          pMVar2 = (this->m_MappedBuffers).
                   super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          in_RCX = (char (*) [32])
                   (((long)(this->m_MappedBuffers).
                           super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 3) *
                   -0x3333333333333333);
          if (in_RCX < pacVar12 || (long)in_RCX - (long)pacVar12 == 0) {
            sVar6 = 0;
          }
          else {
            in_RCX = (char (*) [32])((long)pacVar12 * 5);
            sVar6 = pMVar2[(long)pacVar12].Allocation.AlignedOffset;
          }
        }
        else {
          sVar6 = 0;
        }
        VVar7 = sVar6 + UVar1;
      }
      Offsets[uVar8] = VVar7;
      uVar8 = uVar8 + 1;
      uVar11 = *Args_5;
      pUVar10 = pUVar10 + 2;
    } while (uVar8 < uVar11);
    bVar9 = (bool)(~bVar3 & 1);
  }
  if (uVar11 != 0) {
    if ((this->m_CommandBuffer).m_VkCmdBuffer == (VkCommandBuffer)0x0) {
      FormatString<char[26],char[32]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"BindVertexBuffers",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
                 ,0x1df);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    (*vkCmdBindVertexBuffers)
              ((this->m_CommandBuffer).m_VkCmdBuffer,0,uVar11,vkVertexBuffers,Offsets);
  }
  (this->m_State).CommittedVBsUpToDate = bVar9;
  return;
}

Assistant:

void DeviceContextVkImpl::CommitVkVertexBuffers()
{
#ifdef DILIGENT_DEVELOPMENT
    if (m_NumVertexStreams < m_pPipelineState->GetNumBufferSlotsUsed())
        LOG_ERROR("Currently bound pipeline state '", m_pPipelineState->GetDesc().Name, "' expects ", m_pPipelineState->GetNumBufferSlotsUsed(), " input buffer slots, but only ", m_NumVertexStreams, " is bound");
#endif
    // Do not initialize array with zeros for performance reasons
    VkBuffer     vkVertexBuffers[MAX_BUFFER_SLOTS]; // = {}
    VkDeviceSize Offsets[MAX_BUFFER_SLOTS];
    VERIFY(m_NumVertexStreams <= MAX_BUFFER_SLOTS, "Too many buffers are being set");
    bool DynamicBufferPresent = false;
    for (Uint32 slot = 0; slot < m_NumVertexStreams; ++slot)
    {
        VertexStreamInfo<BufferVkImpl>& CurrStream = m_VertexStreams[slot];
        if (BufferVkImpl* pBufferVk = CurrStream.pBuffer)
        {
            if (pBufferVk->GetDesc().Usage == USAGE_DYNAMIC)
            {
                DynamicBufferPresent = true;
#ifdef DILIGENT_DEVELOPMENT
                DvpVerifyDynamicAllocation(pBufferVk);
#endif
            }

            // Device context keeps strong references to all vertex buffers.

            vkVertexBuffers[slot] = pBufferVk->GetVkBuffer();
            Offsets[slot]         = CurrStream.Offset + GetDynamicBufferOffset(pBufferVk);
        }
        else
        {
            // We can't bind null vertex buffer in Vulkan and have to use a dummy one
            vkVertexBuffers[slot] = m_DummyVB->GetVkBuffer();
            Offsets[slot]         = 0;
        }
    }

    //GraphCtx.FlushResourceBarriers();
    if (m_NumVertexStreams > 0)
        m_CommandBuffer.BindVertexBuffers(0, m_NumVertexStreams, vkVertexBuffers, Offsets);

    // GPU offset for a dynamic vertex buffer can change every time a draw command is invoked
    m_State.CommittedVBsUpToDate = !DynamicBufferPresent;
}